

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed.cc
# Opt level: O0

bool Speed(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *args)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  size_type sVar5;
  mapped_type *pmVar6;
  char *pcVar7;
  long lVar8;
  int *piVar9;
  EVP_AEAD *pEVar10;
  EVP_MD *pEVar11;
  EVP_MD *md;
  TRUST_TOKEN_METHOD *pTVar12;
  byte local_752;
  allocator<char> local_689;
  string local_688;
  byte local_663;
  byte local_662;
  allocator<char> local_661;
  string local_660;
  byte local_63b;
  byte local_63a;
  allocator<char> local_639;
  string local_638;
  byte local_613;
  byte local_612;
  allocator<char> local_611;
  string local_610;
  byte local_5eb;
  byte local_5ea;
  allocator<char> local_5e9;
  string local_5e8;
  byte local_5c3;
  byte local_5c2;
  allocator<char> local_5c1;
  string local_5c0;
  byte local_59b;
  byte local_59a;
  allocator<char> local_599;
  string local_598;
  byte local_573;
  byte local_572;
  allocator<char> local_571;
  string local_570;
  byte local_54b;
  byte local_54a;
  allocator<char> local_549;
  string local_548;
  byte local_523;
  byte local_522;
  allocator<char> local_521;
  string local_520;
  byte local_4fb;
  byte local_4fa;
  allocator<char> local_4f9;
  string local_4f8;
  byte local_4d3;
  byte local_4d2;
  allocator<char> local_4d1;
  string local_4d0;
  byte local_4ab;
  byte local_4aa;
  allocator<char> local_4a9;
  string local_4a8;
  byte local_483;
  byte local_482;
  allocator<char> local_481;
  string local_480;
  byte local_45b;
  byte local_45a;
  allocator<char> local_459;
  string local_458;
  byte local_433;
  byte local_432;
  allocator<char> local_431;
  string local_430;
  byte local_40b;
  byte local_40a;
  allocator<char> local_409;
  string local_408;
  byte local_3e3;
  byte local_3e2;
  allocator<char> local_3e1;
  string local_3e0;
  byte local_3bb;
  byte local_3ba;
  allocator<char> local_3b9;
  string local_3b8;
  byte local_393;
  byte local_392;
  allocator<char> local_391;
  string local_390;
  byte local_36b;
  byte local_36a;
  allocator<char> local_369;
  string local_368;
  byte local_343;
  byte local_342;
  allocator<char> local_341;
  string local_340;
  byte local_31b;
  byte local_31a;
  allocator<char> local_319;
  string local_318;
  byte local_2f3;
  byte local_2f2;
  allocator<char> local_2f1;
  string local_2f0;
  byte local_2cb;
  byte local_2ca;
  allocator<char> local_2c9;
  string local_2c8;
  byte local_2a3;
  byte local_2a2;
  allocator<char> local_2a1;
  string local_2a0;
  byte local_27b;
  byte local_27a;
  allocator<char> local_279;
  string local_278;
  byte local_253;
  byte local_252;
  allocator<char> local_251;
  string local_250;
  ulonglong local_230;
  ulonglong local_228;
  unsigned_long_long val;
  char *ptr;
  key_type local_210;
  char *local_1f0;
  char *end;
  key_type local_1e0;
  char *local_1c0;
  char *start;
  key_type local_1b0;
  allocator<char> local_189;
  key_type local_188;
  allocator<char> local_161;
  key_type local_160;
  allocator<char> local_139;
  key_type local_138;
  allocator<char> local_111;
  key_type local_110;
  allocator<char> local_e9;
  key_type local_e8;
  allocator<char> local_c1;
  key_type local_c0;
  allocator<char> local_99;
  key_type local_98;
  undefined1 local_78 [8];
  string selected;
  undefined1 local_48 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args_map;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  args_map._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)args;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_48);
  bVar2 = ParseKeyValueArguments
                    ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_48,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)args_map._M_t._M_impl.super__Rb_tree_header._M_node_count,kArguments);
  if (bVar2) {
    std::__cxx11::string::string((string *)local_78);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"-filter",&local_99);
    sVar5 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_48,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator(&local_99);
    if (sVar5 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"-filter",&local_c1);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_48,&local_c0);
      std::__cxx11::string::operator=((string *)local_78,(string *)pmVar6);
      std::__cxx11::string::~string((string *)&local_c0);
      std::allocator<char>::~allocator(&local_c1);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"-json",&local_e9);
    sVar5 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_48,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator(&local_e9);
    if (sVar5 != 0) {
      g_print_json = true;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"-timeout",&local_111);
    sVar5 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_48,&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator(&local_111);
    if (sVar5 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"-timeout",&local_139)
      ;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_48,&local_138);
      pcVar7 = (char *)std::__cxx11::string::c_str();
      iVar4 = atoi(pcVar7);
      g_timeout_seconds = (uint64_t)iVar4;
      std::__cxx11::string::~string((string *)&local_138);
      std::allocator<char>::~allocator(&local_139);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"-threads",&local_161);
    sVar5 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_48,&local_160);
    std::__cxx11::string::~string((string *)&local_160);
    std::allocator<char>::~allocator(&local_161);
    if (sVar5 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"-threads",&local_189)
      ;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_48,&local_188);
      pcVar7 = (char *)std::__cxx11::string::c_str();
      g_threads = atoi(pcVar7);
      std::__cxx11::string::~string((string *)&local_188);
      std::allocator<char>::~allocator(&local_189);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b0,"-chunks",(allocator<char> *)((long)&start + 7));
    sVar5 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_48,&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&start + 7));
    if (sVar5 != 0) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear(&g_chunk_lengths);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e0,"-chunks",(allocator<char> *)((long)&end + 7));
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_48,&local_1e0);
      pcVar7 = (char *)std::__cxx11::string::data();
      std::__cxx11::string::~string((string *)&local_1e0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&end + 7));
      local_1c0 = pcVar7;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_210,"-chunks",(allocator<char> *)((long)&ptr + 7));
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_48,&local_210);
      lVar8 = std::__cxx11::string::size();
      std::__cxx11::string::~string((string *)&local_210);
      std::allocator<char>::~allocator((allocator<char> *)((long)&ptr + 7));
      local_1f0 = pcVar7 + lVar8;
      while (local_1c0 != local_1f0) {
        piVar9 = __errno_location();
        *piVar9 = 0;
        local_228 = strtoull(local_1c0,(char **)&val,10);
        if (((char *)val == local_1c0) || (piVar9 = __errno_location(), *piVar9 == 0x22)) {
          fprintf(_stderr,"Error parsing -chunks argument\n");
          args_local._7_1_ = false;
          goto LAB_00139489;
        }
        local_230 = local_228;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (&g_chunk_lengths,&local_230);
        local_1c0 = (char *)val;
        if ((char *)val != local_1f0) {
          if (*(char *)val != ',') {
            fprintf(_stderr,"Error parsing -chunks argument\n");
            args_local._7_1_ = false;
            goto LAB_00139489;
          }
          local_1c0 = (char *)(val + 1);
        }
      }
    }
    if ((g_print_json & 1U) != 0) {
      puts("[");
    }
    local_252 = 0;
    local_253 = 0;
    local_27a = 0;
    local_27b = 0;
    local_2a2 = 0;
    local_2a3 = 0;
    local_2ca = 0;
    local_2cb = 0;
    local_2f2 = 0;
    local_2f3 = 0;
    local_31a = 0;
    local_31b = 0;
    local_342 = 0;
    local_343 = 0;
    local_36a = 0;
    local_36b = 0;
    local_392 = 0;
    local_393 = 0;
    local_3ba = 0;
    local_3bb = 0;
    local_3e2 = 0;
    local_3e3 = 0;
    local_40a = 0;
    local_40b = 0;
    local_432 = 0;
    local_433 = 0;
    local_45a = 0;
    local_45b = 0;
    local_482 = 0;
    local_483 = 0;
    local_4aa = 0;
    local_4ab = 0;
    local_4d2 = 0;
    local_4d3 = 0;
    local_4fa = 0;
    local_4fb = 0;
    local_522 = 0;
    local_523 = 0;
    local_54a = 0;
    local_54b = 0;
    local_572 = 0;
    local_573 = 0;
    local_59a = 0;
    local_59b = 0;
    local_5c2 = 0;
    local_5c3 = 0;
    local_5ea = 0;
    local_5eb = 0;
    local_612 = 0;
    local_613 = 0;
    local_63a = 0;
    local_63b = 0;
    local_662 = 0;
    local_663 = 0;
    bVar1 = false;
    bVar2 = false;
    bVar3 = SpeedRSA((string *)local_78);
    local_752 = 1;
    if (bVar3) {
      pEVar10 = EVP_aead_aegis_128l();
      std::allocator<char>::allocator();
      local_252 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_250,"AEGIS-128L",&local_251);
      local_253 = 1;
      bVar3 = SpeedAEAD(pEVar10,&local_250,0xd,(string *)local_78);
      local_752 = 1;
      if (bVar3) {
        pEVar10 = EVP_aead_aegis_128x2();
        std::allocator<char>::allocator();
        local_27a = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_278,"AEGIS-128X2",&local_279);
        local_27b = 1;
        bVar3 = SpeedAEAD(pEVar10,&local_278,0xd,(string *)local_78);
        local_752 = 1;
        if (bVar3) {
          pEVar10 = EVP_aead_aegis_256();
          std::allocator<char>::allocator();
          local_2a2 = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2a0,"AEGIS-256",&local_2a1);
          local_2a3 = 1;
          bVar3 = SpeedAEAD(pEVar10,&local_2a0,0xd,(string *)local_78);
          local_752 = 1;
          if (bVar3) {
            pEVar10 = EVP_aead_aes_128_gcm();
            std::allocator<char>::allocator();
            local_2ca = 1;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2c8,"AES-128-GCM",&local_2c9);
            local_2cb = 1;
            bVar3 = SpeedAEAD(pEVar10,&local_2c8,0xd,(string *)local_78);
            local_752 = 1;
            if (bVar3) {
              pEVar10 = EVP_aead_aes_256_gcm();
              std::allocator<char>::allocator();
              local_2f2 = 1;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_2f0,"AES-256-GCM",&local_2f1);
              local_2f3 = 1;
              bVar3 = SpeedAEAD(pEVar10,&local_2f0,0xd,(string *)local_78);
              local_752 = 1;
              if (bVar3) {
                pEVar10 = EVP_aead_chacha20_poly1305();
                std::allocator<char>::allocator();
                local_31a = 1;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_318,"ChaCha20-Poly1305",&local_319);
                local_31b = 1;
                bVar3 = SpeedAEAD(pEVar10,&local_318,0xd,(string *)local_78);
                local_752 = 1;
                if (bVar3) {
                  pEVar10 = EVP_aead_des_ede3_cbc_sha1_tls();
                  std::allocator<char>::allocator();
                  local_342 = 1;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_340,"DES-EDE3-CBC-SHA1",&local_341);
                  local_343 = 1;
                  bVar3 = SpeedAEAD(pEVar10,&local_340,0xb,(string *)local_78);
                  local_752 = 1;
                  if (bVar3) {
                    pEVar10 = EVP_aead_aes_128_cbc_sha1_tls();
                    std::allocator<char>::allocator();
                    local_36a = 1;
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_368,"AES-128-CBC-SHA1",&local_369);
                    local_36b = 1;
                    bVar3 = SpeedAEAD(pEVar10,&local_368,0xb,(string *)local_78);
                    local_752 = 1;
                    if (bVar3) {
                      pEVar10 = EVP_aead_aes_256_cbc_sha1_tls();
                      std::allocator<char>::allocator();
                      local_392 = 1;
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_390,"AES-256-CBC-SHA1",&local_391);
                      local_393 = 1;
                      bVar3 = SpeedAEAD(pEVar10,&local_390,0xb,(string *)local_78);
                      local_752 = 1;
                      if (bVar3) {
                        pEVar10 = EVP_aead_aes_128_cbc_sha1_tls();
                        std::allocator<char>::allocator();
                        local_3ba = 1;
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_3b8,"AES-128-CBC-SHA1",&local_3b9);
                        local_3bb = 1;
                        bVar3 = SpeedAEADOpen(pEVar10,&local_3b8,0xb,(string *)local_78);
                        local_752 = 1;
                        if (bVar3) {
                          pEVar10 = EVP_aead_aes_256_cbc_sha1_tls();
                          std::allocator<char>::allocator();
                          local_3e2 = 1;
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&local_3e0,"AES-256-CBC-SHA1",&local_3e1);
                          local_3e3 = 1;
                          bVar3 = SpeedAEADOpen(pEVar10,&local_3e0,0xb,(string *)local_78);
                          local_752 = 1;
                          if (bVar3) {
                            pEVar10 = EVP_aead_aes_128_gcm_siv();
                            std::allocator<char>::allocator();
                            local_40a = 1;
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_408,"AES-128-GCM-SIV",&local_409);
                            local_40b = 1;
                            bVar3 = SpeedAEAD(pEVar10,&local_408,0xd,(string *)local_78);
                            local_752 = 1;
                            if (bVar3) {
                              pEVar10 = EVP_aead_aes_256_gcm_siv();
                              std::allocator<char>::allocator();
                              local_432 = 1;
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&local_430,"AES-256-GCM-SIV",&local_431);
                              local_433 = 1;
                              bVar3 = SpeedAEAD(pEVar10,&local_430,0xd,(string *)local_78);
                              local_752 = 1;
                              if (bVar3) {
                                pEVar10 = EVP_aead_aes_128_gcm_siv();
                                std::allocator<char>::allocator();
                                local_45a = 1;
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_458,"AES-128-GCM-SIV",&local_459);
                                local_45b = 1;
                                bVar3 = SpeedAEADOpen(pEVar10,&local_458,0xd,(string *)local_78);
                                local_752 = 1;
                                if (bVar3) {
                                  pEVar10 = EVP_aead_aes_256_gcm_siv();
                                  std::allocator<char>::allocator();
                                  local_482 = 1;
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)&local_480,"AES-256-GCM-SIV",&local_481);
                                  local_483 = 1;
                                  bVar3 = SpeedAEADOpen(pEVar10,&local_480,0xd,(string *)local_78);
                                  local_752 = 1;
                                  if (bVar3) {
                                    pEVar10 = EVP_aead_aes_128_ccm_bluetooth();
                                    std::allocator<char>::allocator();
                                    local_4aa = 1;
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((string *)&local_4a8,"AES-128-CCM-Bluetooth",
                                               &local_4a9);
                                    local_4ab = 1;
                                    bVar3 = SpeedAEAD(pEVar10,&local_4a8,0xd,(string *)local_78);
                                    local_752 = 1;
                                    if (bVar3) {
                                      std::allocator<char>::allocator();
                                      local_4d2 = 1;
                                      std::__cxx11::string::string<std::allocator<char>>
                                                ((string *)&local_4d0,"AES-128",&local_4d1);
                                      local_4d3 = 1;
                                      bVar3 = SpeedAESBlock(&local_4d0,0x80,(string *)local_78);
                                      local_752 = 1;
                                      if (bVar3) {
                                        std::allocator<char>::allocator();
                                        local_4fa = 1;
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_4f8,"AES-256",&local_4f9);
                                        local_4fb = 1;
                                        bVar3 = SpeedAESBlock(&local_4f8,0x100,(string *)local_78);
                                        local_752 = 1;
                                        if (bVar3) {
                                          pEVar11 = EVP_sha1();
                                          std::allocator<char>::allocator();
                                          local_522 = 1;
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    ((string *)&local_520,"SHA-1",&local_521);
                                          local_523 = 1;
                                          bVar3 = SpeedHash((EVP_MD *)pEVar11,&local_520,
                                                            (string *)local_78);
                                          local_752 = 1;
                                          if (bVar3) {
                                            pEVar11 = EVP_sha256();
                                            std::allocator<char>::allocator();
                                            local_54a = 1;
                                            std::__cxx11::string::string<std::allocator<char>>
                                                      ((string *)&local_548,"SHA-256",&local_549);
                                            local_54b = 1;
                                            bVar3 = SpeedHash((EVP_MD *)pEVar11,&local_548,
                                                              (string *)local_78);
                                            local_752 = 1;
                                            if (bVar3) {
                                              pEVar11 = EVP_sha512();
                                              std::allocator<char>::allocator();
                                              local_572 = 1;
                                              std::__cxx11::string::string<std::allocator<char>>
                                                        ((string *)&local_570,"SHA-512",&local_571);
                                              local_573 = 1;
                                              bVar3 = SpeedHash((EVP_MD *)pEVar11,&local_570,
                                                                (string *)local_78);
                                              local_752 = 1;
                                              if (bVar3) {
                                                md = EVP_blake2b256();
                                                std::allocator<char>::allocator();
                                                local_59a = 1;
                                                std::__cxx11::string::string<std::allocator<char>>
                                                          ((string *)&local_598,"BLAKE2b-256",
                                                           &local_599);
                                                local_59b = 1;
                                                bVar3 = SpeedHash(md,&local_598,(string *)local_78);
                                                local_752 = 1;
                                                if (bVar3) {
                                                  bVar3 = SpeedRandom((string *)local_78);
                                                  local_752 = 1;
                                                  if (bVar3) {
                                                    bVar3 = SpeedECDH((string *)local_78);
                                                    local_752 = 1;
                                                    if (bVar3) {
                                                      bVar3 = SpeedECDSA((string *)local_78);
                                                      local_752 = 1;
                                                      if (bVar3) {
                                                        bVar3 = Speed25519((string *)local_78);
                                                        local_752 = 1;
                                                        if (bVar3) {
                                                          bVar3 = SpeedSPAKE2((string *)local_78);
                                                          local_752 = 1;
                                                          if (bVar3) {
                                                            bVar3 = SpeedScrypt((string *)local_78);
                                                            local_752 = 1;
                                                            if (bVar3) {
                                                              bVar3 = SpeedRSAKeyGen((string *)
                                                                                     local_78);
                                                              local_752 = 1;
                                                              if (bVar3) {
                                                                bVar3 = SpeedHRSS((string *)local_78
                                                                                 );
                                                                local_752 = 1;
                                                                if (bVar3) {
                                                                  bVar3 = SpeedKyber((string *)
                                                                                     local_78);
                                                                  local_752 = 1;
                                                                  if (bVar3) {
                                                                    bVar3 = SpeedMLDSA((string *)
                                                                                       local_78);
                                                                    local_752 = 1;
                                                                    if (bVar3) {
                                                                      bVar3 = SpeedMLKEM((string *)
                                                                                         local_78);
                                                                      local_752 = 1;
                                                                      if (bVar3) {
                                                                        bVar3 = SpeedMLKEM1024((
                                                  string *)local_78);
                                                  local_752 = 1;
                                                  if (bVar3) {
                                                    bVar3 = SpeedSLHDSA((string *)local_78);
                                                    local_752 = 1;
                                                    if (bVar3) {
                                                      bVar3 = SpeedHashToCurve((string *)local_78);
                                                      local_752 = 1;
                                                      if (bVar3) {
                                                        std::allocator<char>::allocator();
                                                        local_5c2 = 1;
                                                        std::__cxx11::string::
                                                        string<std::allocator<char>>
                                                                  ((string *)&local_5c0,
                                                                   "TrustToken-Exp1-Batch1",
                                                                   &local_5c1);
                                                        local_5c3 = 1;
                                                        pTVar12 = TRUST_TOKEN_experiment_v1();
                                                        bVar3 = SpeedTrustToken(&local_5c0,pTVar12,1
                                                                                ,(string *)local_78)
                                                        ;
                                                        local_752 = 1;
                                                        if (bVar3) {
                                                          std::allocator<char>::allocator();
                                                          local_5ea = 1;
                                                          std::__cxx11::string::
                                                          string<std::allocator<char>>
                                                                    ((string *)&local_5e8,
                                                                     "TrustToken-Exp1-Batch10",
                                                                     &local_5e9);
                                                          local_5eb = 1;
                                                          pTVar12 = TRUST_TOKEN_experiment_v1();
                                                          bVar3 = SpeedTrustToken(&local_5e8,pTVar12
                                                                                  ,10,(string *)
                                                                                      local_78);
                                                          local_752 = 1;
                                                          if (bVar3) {
                                                            std::allocator<char>::allocator();
                                                            local_612 = 1;
                                                            std::__cxx11::string::
                                                            string<std::allocator<char>>
                                                                      ((string *)&local_610,
                                                                       "TrustToken-Exp2VOPRF-Batch1"
                                                                       ,&local_611);
                                                            local_613 = 1;
                                                            pTVar12 = 
                                                  TRUST_TOKEN_experiment_v2_voprf();
                                                  bVar3 = SpeedTrustToken(&local_610,pTVar12,1,
                                                                          (string *)local_78);
                                                  local_752 = 1;
                                                  if (bVar3) {
                                                    std::allocator<char>::allocator();
                                                    local_63a = 1;
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_638,
                                                               "TrustToken-Exp2VOPRF-Batch10",
                                                               &local_639);
                                                    local_63b = 1;
                                                    pTVar12 = TRUST_TOKEN_experiment_v2_voprf();
                                                    bVar3 = SpeedTrustToken(&local_638,pTVar12,10,
                                                                            (string *)local_78);
                                                    local_752 = 1;
                                                    if (bVar3) {
                                                      std::allocator<char>::allocator();
                                                      local_662 = 1;
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_660,
                                                                 "TrustToken-Exp2PMB-Batch1",
                                                                 &local_661);
                                                      local_663 = 1;
                                                      pTVar12 = TRUST_TOKEN_experiment_v2_pmb();
                                                      bVar3 = SpeedTrustToken(&local_660,pTVar12,1,
                                                                              (string *)local_78);
                                                      local_752 = 1;
                                                      if (bVar3) {
                                                        std::allocator<char>::allocator();
                                                        bVar1 = true;
                                                        std::__cxx11::string::
                                                        string<std::allocator<char>>
                                                                  ((string *)&local_688,
                                                                   "TrustToken-Exp2PMB-Batch10",
                                                                   &local_689);
                                                        bVar2 = true;
                                                        pTVar12 = TRUST_TOKEN_experiment_v2_pmb();
                                                        bVar3 = SpeedTrustToken(&local_688,pTVar12,
                                                                                10,(string *)
                                                                                   local_78);
                                                        local_752 = 1;
                                                        if (bVar3) {
                                                          bVar3 = SpeedBase64((string *)local_78);
                                                          local_752 = 1;
                                                          if (bVar3) {
                                                            bVar3 = SpeedSipHash((string *)local_78)
                                                            ;
                                                            local_752 = bVar3 ^ 0xff;
                                                          }
                                                        }
                                                      }
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    if (bVar2) {
      std::__cxx11::string::~string((string *)&local_688);
    }
    if (bVar1) {
      std::allocator<char>::~allocator(&local_689);
    }
    if ((local_663 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_660);
    }
    if ((local_662 & 1) != 0) {
      std::allocator<char>::~allocator(&local_661);
    }
    if ((local_63b & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_638);
    }
    if ((local_63a & 1) != 0) {
      std::allocator<char>::~allocator(&local_639);
    }
    if ((local_613 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_610);
    }
    if ((local_612 & 1) != 0) {
      std::allocator<char>::~allocator(&local_611);
    }
    if ((local_5eb & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_5e8);
    }
    if ((local_5ea & 1) != 0) {
      std::allocator<char>::~allocator(&local_5e9);
    }
    if ((local_5c3 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_5c0);
    }
    if ((local_5c2 & 1) != 0) {
      std::allocator<char>::~allocator(&local_5c1);
    }
    if ((local_59b & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_598);
    }
    if ((local_59a & 1) != 0) {
      std::allocator<char>::~allocator(&local_599);
    }
    if ((local_573 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_570);
    }
    if ((local_572 & 1) != 0) {
      std::allocator<char>::~allocator(&local_571);
    }
    if ((local_54b & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_548);
    }
    if ((local_54a & 1) != 0) {
      std::allocator<char>::~allocator(&local_549);
    }
    if ((local_523 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_520);
    }
    if ((local_522 & 1) != 0) {
      std::allocator<char>::~allocator(&local_521);
    }
    if ((local_4fb & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_4f8);
    }
    if ((local_4fa & 1) != 0) {
      std::allocator<char>::~allocator(&local_4f9);
    }
    if ((local_4d3 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_4d0);
    }
    if ((local_4d2 & 1) != 0) {
      std::allocator<char>::~allocator(&local_4d1);
    }
    if ((local_4ab & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_4a8);
    }
    if ((local_4aa & 1) != 0) {
      std::allocator<char>::~allocator(&local_4a9);
    }
    if ((local_483 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_480);
    }
    if ((local_482 & 1) != 0) {
      std::allocator<char>::~allocator(&local_481);
    }
    if ((local_45b & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_458);
    }
    if ((local_45a & 1) != 0) {
      std::allocator<char>::~allocator(&local_459);
    }
    if ((local_433 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_430);
    }
    if ((local_432 & 1) != 0) {
      std::allocator<char>::~allocator(&local_431);
    }
    if ((local_40b & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_408);
    }
    if ((local_40a & 1) != 0) {
      std::allocator<char>::~allocator(&local_409);
    }
    if ((local_3e3 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_3e0);
    }
    if ((local_3e2 & 1) != 0) {
      std::allocator<char>::~allocator(&local_3e1);
    }
    if ((local_3bb & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_3b8);
    }
    if ((local_3ba & 1) != 0) {
      std::allocator<char>::~allocator(&local_3b9);
    }
    if ((local_393 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_390);
    }
    if ((local_392 & 1) != 0) {
      std::allocator<char>::~allocator(&local_391);
    }
    if ((local_36b & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_368);
    }
    if ((local_36a & 1) != 0) {
      std::allocator<char>::~allocator(&local_369);
    }
    if ((local_343 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_340);
    }
    if ((local_342 & 1) != 0) {
      std::allocator<char>::~allocator(&local_341);
    }
    if ((local_31b & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_318);
    }
    if ((local_31a & 1) != 0) {
      std::allocator<char>::~allocator(&local_319);
    }
    if ((local_2f3 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_2f0);
    }
    if ((local_2f2 & 1) != 0) {
      std::allocator<char>::~allocator(&local_2f1);
    }
    if ((local_2cb & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_2c8);
    }
    if ((local_2ca & 1) != 0) {
      std::allocator<char>::~allocator(&local_2c9);
    }
    if ((local_2a3 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_2a0);
    }
    if ((local_2a2 & 1) != 0) {
      std::allocator<char>::~allocator(&local_2a1);
    }
    if ((local_27b & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_278);
    }
    if ((local_27a & 1) != 0) {
      std::allocator<char>::~allocator(&local_279);
    }
    if ((local_253 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_250);
    }
    if ((local_252 & 1) != 0) {
      std::allocator<char>::~allocator(&local_251);
    }
    if ((local_752 & 1) == 0) {
      if ((g_print_json & 1U) != 0) {
        puts("\n]");
      }
      args_local._7_1_ = true;
    }
    else {
      args_local._7_1_ = false;
    }
LAB_00139489:
    selected.field_2._8_4_ = 1;
    std::__cxx11::string::~string((string *)local_78);
  }
  else {
    PrintUsage(kArguments);
    args_local._7_1_ = false;
    selected.field_2._8_4_ = 1;
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_48);
  return args_local._7_1_;
}

Assistant:

bool Speed(const std::vector<std::string> &args) {
  std::map<std::string, std::string> args_map;
  if (!ParseKeyValueArguments(&args_map, args, kArguments)) {
    PrintUsage(kArguments);
    return false;
  }

  std::string selected;
  if (args_map.count("-filter") != 0) {
    selected = args_map["-filter"];
  }

  if (args_map.count("-json") != 0) {
    g_print_json = true;
  }

  if (args_map.count("-timeout") != 0) {
    g_timeout_seconds = atoi(args_map["-timeout"].c_str());
  }

#if defined(OPENSSL_THREADS)
  if (args_map.count("-threads") != 0) {
    g_threads = atoi(args_map["-threads"].c_str());
  }
#endif

  if (args_map.count("-chunks") != 0) {
    g_chunk_lengths.clear();
    const char *start = args_map["-chunks"].data();
    const char *end = start + args_map["-chunks"].size();
    while (start != end) {
      errno = 0;
      char *ptr;
      unsigned long long val = strtoull(start, &ptr, 10);
      if (ptr == start /* no numeric characters found */ ||
          errno == ERANGE /* overflow */ || static_cast<size_t>(val) != val) {
        fprintf(stderr, "Error parsing -chunks argument\n");
        return false;
      }
      g_chunk_lengths.push_back(static_cast<size_t>(val));
      start = ptr;
      if (start != end) {
        if (*start != ',') {
          fprintf(stderr, "Error parsing -chunks argument\n");
          return false;
        }
        start++;
      }
    }
  }

  // kTLSADLen is the number of bytes of additional data that TLS passes to
  // AEADs.
  static const size_t kTLSADLen = 13;
  // kLegacyADLen is the number of bytes that TLS passes to the "legacy" AEADs.
  // These are AEADs that weren't originally defined as AEADs, but which we use
  // via the AEAD interface. In order for that to work, they have some TLS
  // knowledge in them and construct a couple of the AD bytes internally.
  static const size_t kLegacyADLen = kTLSADLen - 2;

  if (g_print_json) {
    puts("[");
  }
  if (!SpeedRSA(selected) ||
      !SpeedAEAD(EVP_aead_aegis_128l(), "AEGIS-128L", kTLSADLen, selected) ||
      !SpeedAEAD(EVP_aead_aegis_128x2(), "AEGIS-128X2", kTLSADLen, selected) ||
      !SpeedAEAD(EVP_aead_aegis_256(), "AEGIS-256", kTLSADLen, selected) ||
      !SpeedAEAD(EVP_aead_aes_128_gcm(), "AES-128-GCM", kTLSADLen, selected) ||
      !SpeedAEAD(EVP_aead_aes_256_gcm(), "AES-256-GCM", kTLSADLen, selected) ||
      !SpeedAEAD(EVP_aead_chacha20_poly1305(), "ChaCha20-Poly1305", kTLSADLen,
                 selected) ||
      !SpeedAEAD(EVP_aead_des_ede3_cbc_sha1_tls(), "DES-EDE3-CBC-SHA1",
                 kLegacyADLen, selected) ||
      !SpeedAEAD(EVP_aead_aes_128_cbc_sha1_tls(), "AES-128-CBC-SHA1",
                 kLegacyADLen, selected) ||
      !SpeedAEAD(EVP_aead_aes_256_cbc_sha1_tls(), "AES-256-CBC-SHA1",
                 kLegacyADLen, selected) ||
      !SpeedAEADOpen(EVP_aead_aes_128_cbc_sha1_tls(), "AES-128-CBC-SHA1",
                     kLegacyADLen, selected) ||
      !SpeedAEADOpen(EVP_aead_aes_256_cbc_sha1_tls(), "AES-256-CBC-SHA1",
                     kLegacyADLen, selected) ||
      !SpeedAEAD(EVP_aead_aes_128_gcm_siv(), "AES-128-GCM-SIV", kTLSADLen,
                 selected) ||
      !SpeedAEAD(EVP_aead_aes_256_gcm_siv(), "AES-256-GCM-SIV", kTLSADLen,
                 selected) ||
      !SpeedAEADOpen(EVP_aead_aes_128_gcm_siv(), "AES-128-GCM-SIV", kTLSADLen,
                     selected) ||
      !SpeedAEADOpen(EVP_aead_aes_256_gcm_siv(), "AES-256-GCM-SIV", kTLSADLen,
                     selected) ||
      !SpeedAEAD(EVP_aead_aes_128_ccm_bluetooth(), "AES-128-CCM-Bluetooth",
                 kTLSADLen, selected) ||
      !SpeedAESBlock("AES-128", 128, selected) ||
      !SpeedAESBlock("AES-256", 256, selected) ||
      !SpeedHash(EVP_sha1(), "SHA-1", selected) ||
      !SpeedHash(EVP_sha256(), "SHA-256", selected) ||
      !SpeedHash(EVP_sha512(), "SHA-512", selected) ||
      !SpeedHash(EVP_blake2b256(), "BLAKE2b-256", selected) ||
      !SpeedRandom(selected) ||       //
      !SpeedECDH(selected) ||         //
      !SpeedECDSA(selected) ||        //
      !Speed25519(selected) ||        //
      !SpeedSPAKE2(selected) ||       //
      !SpeedScrypt(selected) ||       //
      !SpeedRSAKeyGen(selected) ||    //
      !SpeedHRSS(selected) ||         //
      !SpeedKyber(selected) ||        //
      !SpeedMLDSA(selected) ||        //
      !SpeedMLKEM(selected) ||        //
      !SpeedMLKEM1024(selected) ||    //
      !SpeedSLHDSA(selected) ||       //
      !SpeedHashToCurve(selected) ||  //
      !SpeedTrustToken("TrustToken-Exp1-Batch1", TRUST_TOKEN_experiment_v1(), 1,
                       selected) ||
      !SpeedTrustToken("TrustToken-Exp1-Batch10", TRUST_TOKEN_experiment_v1(),
                       10, selected) ||
      !SpeedTrustToken("TrustToken-Exp2VOPRF-Batch1",
                       TRUST_TOKEN_experiment_v2_voprf(), 1, selected) ||
      !SpeedTrustToken("TrustToken-Exp2VOPRF-Batch10",
                       TRUST_TOKEN_experiment_v2_voprf(), 10, selected) ||
      !SpeedTrustToken("TrustToken-Exp2PMB-Batch1",
                       TRUST_TOKEN_experiment_v2_pmb(), 1, selected) ||
      !SpeedTrustToken("TrustToken-Exp2PMB-Batch10",
                       TRUST_TOKEN_experiment_v2_pmb(), 10, selected) ||
      !SpeedBase64(selected) ||  //
      !SpeedSipHash(selected)) {
    return false;
  }
#if defined(BORINGSSL_FIPS)
  if (!SpeedSelfTest(selected)) {
    return false;
  }
#endif
  if (g_print_json) {
    puts("\n]");
  }

  return true;
}